

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_width<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  error_handler eVar1;
  uint uVar2;
  byte bVar3;
  error_handler *peVar4;
  width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>_&,_char>
  local_10;
  
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format.h"
                ,0xb18,"");
  }
  bVar3 = *begin - 0x30;
  if (bVar3 < 10) {
    if (9 < bVar3) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format.h"
                  ,0x92f,"");
    }
    peVar4 = (error_handler *)(begin + 1);
    uVar2 = 0;
    do {
      if (0xccccccc < uVar2) {
        uVar2 = 0x80000000;
        break;
      }
      uVar2 = ((int)(char)peVar4[-1] + uVar2 * 10) - 0x30;
      if (peVar4 == (error_handler *)end) goto LAB_0020a40e;
      eVar1 = *peVar4;
      peVar4 = peVar4 + 1;
    } while ((byte)((char)eVar1 - 0x30U) < 10);
    end = (char *)(peVar4 + -1);
    peVar4 = (error_handler *)end;
LAB_0020a40e:
    if ((int)uVar2 < 0) {
      error_handler::on_error(peVar4,"number is too big");
    }
    ((handler->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->width = uVar2;
    begin = end;
  }
  else if (*begin == '{') {
    peVar4 = (error_handler *)(begin + 1);
    if (peVar4 != (error_handler *)end) {
      local_10.handler = handler;
      peVar4 = (error_handler *)
               parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&,char>>
                         ((char *)peVar4,end,&local_10);
    }
    if ((peVar4 == (error_handler *)end) || (*peVar4 != (error_handler)0x7d)) {
      error_handler::on_error(peVar4,"invalid format string");
    }
    begin = (char *)(peVar4 + 1);
  }
  return (char *)(error_handler *)begin;
}

Assistant:

FMT_CONSTEXPR const Char* parse_width(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}